

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void densePOTRS(realtype **a,sunindextype m,realtype *b)

{
  realtype *prVar1;
  long local_40;
  sunindextype j;
  sunindextype i;
  realtype *col_i;
  realtype *col_j;
  realtype *b_local;
  sunindextype m_local;
  realtype **a_local;
  
  for (local_40 = 0; local_40 < m + -1; local_40 = local_40 + 1) {
    prVar1 = a[local_40];
    b[local_40] = b[local_40] / prVar1[local_40];
    j = local_40;
    while (j = j + 1, j < m) {
      b[j] = -b[local_40] * prVar1[j] + b[j];
    }
  }
  b[m + -1] = b[m + -1] / a[m + -1][m + -1];
  b[m + -1] = b[m + -1] / a[m + -1][m + -1];
  for (j = m + -2; -1 < j; j = j + -1) {
    prVar1 = a[j];
    local_40 = j;
    while (local_40 = local_40 + 1, local_40 < m) {
      b[j] = -prVar1[local_40] * b[local_40] + b[j];
    }
    b[j] = b[j] / prVar1[j];
  }
  return;
}

Assistant:

void densePOTRS(realtype **a, sunindextype m, realtype *b)
{
  realtype *col_j, *col_i;
  sunindextype i, j;

  /* Solve C y = b, forward substitution - column version.
     Store solution y in b */
  for (j=0; j < m-1; j++) {
    col_j = a[j];
    b[j] /= col_j[j];
    for (i=j+1; i < m; i++)
      b[i] -= b[j]*col_j[i];
  }
  col_j = a[m-1];
  b[m-1] /= col_j[m-1];

  /* Solve C^T x = y, backward substitution - row version.
     Store solution x in b */
  col_j = a[m-1];
  b[m-1] /= col_j[m-1];
  for (i=m-2; i>=0; i--) {
    col_i = a[i];
    for (j=i+1; j<m; j++) 
      b[i] -= col_i[j]*b[j];
    b[i] /= col_i[i];
  }

}